

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *classes)

{
  element_type *peVar1;
  TreeEnsembleClassifier *pTVar2;
  StringVector *pSVar3;
  string *psVar4;
  const_reference pvVar5;
  string *category;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *classes_local;
  TreeEnsembleClassifier *this_local;
  
  peVar1 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  pTVar2 = Specification::Model::mutable_treeensembleclassifier(peVar1);
  pSVar3 = Specification::TreeEnsembleClassifier::mutable_stringclasslabels(pTVar2);
  Specification::StringVector::clear_vector(pSVar3);
  category = (string *)0x0;
  while( true ) {
    psVar4 = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(classes);
    if (psVar4 <= category) break;
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
    pTVar2 = Specification::Model::mutable_treeensembleclassifier(peVar1);
    pSVar3 = Specification::TreeEnsembleClassifier::mutable_stringclasslabels(pTVar2);
    psVar4 = Specification::StringVector::add_vector_abi_cxx11_(pSVar3);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](classes,(size_type)category);
    std::__cxx11::string::operator=((string *)psVar4,(string *)pvVar5);
    category = (string *)&category->field_0x1;
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<std::string>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_stringclasslabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            std::string *category = m_spec->mutable_treeensembleclassifier()->mutable_stringclasslabels()->add_vector();
            *category = classes[i];
        }
    }